

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_GlobalScanMin_Test::TestBody(MxxReduce_GlobalScanMin_Test *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  char *pcVar8;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_2;
  size_t i_2;
  Message local_120;
  size_type local_118;
  size_type local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> result;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  size_t i_1;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> local_cpy;
  size_t i;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> local;
  size_t n;
  comm c;
  MxxReduce_GlobalScanMin_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)&n);
  iVar3 = mxx::comm::size((comm *)&n);
  __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar3;
  std::allocator<int>::allocator((allocator<int> *)((long)&i + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,(size_type)__n,
             (allocator<int> *)((long)&i + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&i + 7));
  for (local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage < __n;
      local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    iVar4 = mxx::comm::rank((comm *)&n);
    iVar1 = (int)local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_60,
                        (size_type)
                        local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pvVar5 = iVar4 * iVar3 + iVar1 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,
             (vector<int,_std::allocator<int>_> *)local_60);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_88);
  iVar7 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_88)
  ;
  mxx::
  global_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
            (iVar6._M_current,iVar7._M_current,&n);
  for (gtest_ar.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar.message_.ptr_ < __n;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar.message_.ptr_)->field_0x1) {
    local_bc = 1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_88,
                        (size_type)gtest_ar.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b8,"1","local_cpy[i]",&local_bc,pvVar5);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar2) {
      testing::Message::Message(&local_c8);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x122,pcVar8);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._5_3_ = 0;
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ != 0) goto LAB_0014765c;
  }
  mxx::global_scan<int,mxx::min<int>>(local_f0,(mxx *)local_60,&n);
  local_110 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_60);
  local_118 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_f0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_108,"local.size()","result.size()",&local_110,&local_118);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(&local_120);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0x126,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
    testing::Message::~Message(&local_120);
  }
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_3_ = 0;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    for (gtest_ar_2.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_2.message_.ptr_ < __n;
        gtest_ar_2.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_2.message_.ptr_)->field_0x1) {
      local_144 = 1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_f0,
                          (size_type)gtest_ar_2.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_140,"1","result[i]",&local_144,pvVar5);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
      if (!bVar2) {
        testing::Message::Message(&local_150);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x129,pcVar8);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::Message::~Message(&local_150);
      }
      result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._5_3_ = 0;
      result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ != 0) goto LAB_00147650;
    }
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
LAB_00147650:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
LAB_0014765c:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  mxx::comm::~comm((comm *)&n);
  return;
}

Assistant:

TEST(MxxReduce, GlobalScanMin) {
    mxx::comm c;
    // test scan with min and an array of positive
    // elements sorted in ascending order
    size_t n = c.size();
    std::vector<int> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = (c.rank()*n)+i+1;
    }
    // test inplace scan
    std::vector<int> local_cpy(local);
    mxx::global_scan_inplace(local_cpy.begin(), local_cpy.end(), mxx::min<int>(), c);
    for (size_t i = 0; i < n; ++i) {
        // 1 is both the first as well as the minimum element
        ASSERT_EQ(1, local_cpy[i]);
    }
    // test scan
    std::vector<int> result = mxx::global_scan(local, mxx::min<int>(), c);
    ASSERT_EQ(local.size(), result.size());
    for (size_t i = 0; i < n; ++i) {
        // 1 is both the first as well as the minimum element
        ASSERT_EQ(1, result[i]);
    }
}